

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Update(Parse *pParse,SrcList *pTabList,ExprList *pChanges,Expr *pWhere,int onError)

{
  sqlite3 *db_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int p3;
  int p2;
  int iVar4;
  u32 uVar5;
  Table *pTab_00;
  Vdbe *v_00;
  WhereInfo *pWInfo_00;
  KeyInfo *zP4;
  int local_17c;
  uint local_154;
  char *local_150;
  int j1;
  u32 oldmask;
  int a1;
  KeyInfo *pKey;
  int reg;
  int rc;
  int regRowSet;
  int regOld;
  int regNew;
  int regNewRowid;
  int regOldRowid;
  int regRowCount;
  int newmask;
  int tmask;
  Trigger *pTrigger;
  int isView;
  int hasFK;
  int okOnePass;
  int iDb;
  NameContext sNC;
  AuthContext sContext;
  Expr *pEStack_90;
  int openAll;
  Expr *pRowidExpr;
  int *piStack_80;
  int chngRowid;
  int *aXRef;
  int *aRegIdx;
  sqlite3 *db;
  int iCur;
  int nIdx;
  Index *pIdx;
  Vdbe *v;
  WhereInfo *pWInfo;
  int addr;
  Table *pTab;
  int local_30;
  int j;
  int i;
  int onError_local;
  Expr *pWhere_local;
  ExprList *pChanges_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  aXRef = (int *)0x0;
  piStack_80 = (int *)0x0;
  pEStack_90 = (Expr *)0x0;
  bVar1 = false;
  regNewRowid = 0;
  rc = 0;
  memset(&sNC.ncFlags,0,0x10);
  db_00 = pParse->db;
  _i = pWhere;
  pChanges_local = (ExprList *)pTabList;
  if (((pParse->nErr == 0) && (db_00->mallocFailed == '\0')) &&
     (pTab_00 = sqlite3SrcListLookup(pParse,pTabList), pTab_00 != (Table *)0x0)) {
    hasFK = sqlite3SchemaToIndex(pParse->db,pTab_00->pSchema);
    _newmask = sqlite3TriggersExist(pParse,pTab_00,0x6b,pChanges,&regRowCount);
    pTrigger._0_4_ = (uint)(pTab_00->pSelect != (Select *)0x0);
    iVar2 = sqlite3ViewGetColumnNames(pParse,pTab_00);
    if (((iVar2 == 0) && (iVar2 = sqlite3IsReadOnly(pParse,pTab_00,regRowCount), iVar2 == 0)) &&
       (piStack_80 = (int *)sqlite3DbMallocRaw(db_00,(int)pTab_00->nCol << 2),
       piStack_80 != (int *)0x0)) {
      for (local_30 = 0; local_30 < pTab_00->nCol; local_30 = local_30 + 1) {
        piStack_80[local_30] = -1;
      }
      iVar2 = pParse->nTab;
      pParse->nTab = iVar2 + 1;
      pTabList->a[0].iCursor = iVar2;
      for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
        pParse->nTab = pParse->nTab + 1;
      }
      memset(&okOnePass,0,0x38);
      pRowidExpr._4_4_ = 0;
      _okOnePass = pParse;
      sNC.pParse = (Parse *)pTabList;
      for (local_30 = 0; local_30 < pChanges->nExpr; local_30 = local_30 + 1) {
        iVar3 = sqlite3ResolveExprNames((NameContext *)&okOnePass,pChanges->a[local_30].pExpr);
        if (iVar3 != 0) goto LAB_001bbde0;
        for (pTab._4_4_ = 0; pTab._4_4_ < pTab_00->nCol; pTab._4_4_ = pTab._4_4_ + 1) {
          iVar3 = sqlite3_stricmp(pTab_00->aCol[pTab._4_4_].zName,pChanges->a[local_30].zName);
          if (iVar3 == 0) {
            if (pTab._4_4_ == pTab_00->iPKey) {
              pRowidExpr._4_4_ = 1;
              pEStack_90 = pChanges->a[local_30].pExpr;
            }
            piStack_80[pTab._4_4_] = local_30;
            break;
          }
        }
        if (pTab_00->nCol <= pTab._4_4_) {
          iVar3 = sqlite3IsRowid(pChanges->a[local_30].zName);
          if (iVar3 == 0) {
            sqlite3ErrorMsg(pParse,"no such column: %s",pChanges->a[local_30].zName);
            pParse->checkSchema = '\x01';
            goto LAB_001bbde0;
          }
          pTab._4_4_ = -1;
          pRowidExpr._4_4_ = 1;
          pEStack_90 = pChanges->a[local_30].pExpr;
        }
        if (pTab._4_4_ < 0) {
          local_150 = "ROWID";
        }
        else {
          local_150 = pTab_00->aCol[pTab._4_4_].zName;
        }
        iVar3 = sqlite3AuthCheck(pParse,0x17,pTab_00->zName,local_150,db_00->aDb[hasFK].zName);
        if (iVar3 == 1) goto LAB_001bbde0;
        if (iVar3 == 2) {
          piStack_80[pTab._4_4_] = -1;
        }
      }
      pTrigger._4_4_ = sqlite3FkRequired(pParse,pTab_00,piStack_80,pRowidExpr._4_4_);
      db._4_4_ = 0;
      for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
        db._4_4_ = db._4_4_ + 1;
      }
      if ((db._4_4_ < 1) ||
         (aXRef = (int *)sqlite3DbMallocRaw(db_00,db._4_4_ << 3), aXRef != (int *)0x0)) {
        pTab._4_4_ = 0;
        for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
          if ((pTrigger._4_4_ == 0) && (pRowidExpr._4_4_ == 0)) {
            pKey._0_4_ = 0;
            for (local_30 = 0; local_30 < (int)(uint)_iCur->nColumn; local_30 = local_30 + 1) {
              if (-1 < piStack_80[_iCur->aiColumn[local_30]]) {
                pKey._0_4_ = pParse->nMem + 1;
                pParse->nMem = (int)pKey;
                break;
              }
            }
          }
          else {
            pKey._0_4_ = pParse->nMem + 1;
            pParse->nMem = (int)pKey;
          }
          aXRef[pTab._4_4_] = (int)pKey;
          pTab._4_4_ = pTab._4_4_ + 1;
        }
        v_00 = sqlite3GetVdbe(pParse);
        if (v_00 != (Vdbe *)0x0) {
          if (pParse->nested == '\0') {
            sqlite3VdbeCountChanges(v_00);
          }
          sqlite3BeginWriteOperation(pParse,1,hasFK);
          if ((pTab_00->tabFlags & 0x10) == 0) {
            iVar3 = pParse->nMem + 1;
            pParse->nMem = iVar3;
            p3 = pParse->nMem + 1;
            pParse->nMem = p3;
            if ((_newmask != (Trigger *)0x0) || (pTrigger._4_4_ != 0)) {
              rc = pParse->nMem + 1;
              pParse->nMem = (int)pTab_00->nCol + pParse->nMem;
            }
            if (((pRowidExpr._4_4_ != 0) || (_newmask != (Trigger *)0x0)) ||
               (regOld = p3, pTrigger._4_4_ != 0)) {
              regOld = pParse->nMem + 1;
              pParse->nMem = regOld;
            }
            p2 = pParse->nMem + 1;
            pParse->nMem = (int)pTab_00->nCol + pParse->nMem;
            if ((uint)pTrigger != 0) {
              sqlite3AuthContextPush(pParse,(AuthContext *)&sNC.ncFlags,pTab_00->zName);
            }
            if ((uint)pTrigger != 0) {
              sqlite3MaterializeView(pParse,pTab_00,pWhere,iVar2);
            }
            iVar4 = sqlite3ResolveExprNames((NameContext *)&okOnePass,pWhere);
            if (iVar4 == 0) {
              sqlite3VdbeAddOp3(v_00,10,0,iVar3,p3);
              pWInfo_00 = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,4
                                            ,0);
              if (pWInfo_00 != (WhereInfo *)0x0) {
                isView = (int)pWInfo_00->okOnePass;
                sqlite3VdbeAddOp2(v_00,0x41,iVar2,p3);
                if (isView == 0) {
                  sqlite3VdbeAddOp2(v_00,0x70,iVar3,p3);
                }
                sqlite3WhereEnd(pWInfo_00);
                if (((db_00->flags & 0x10U) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
                  regNewRowid = pParse->nMem + 1;
                  pParse->nMem = regNewRowid;
                  sqlite3VdbeAddOp2(v_00,7,0,regNewRowid);
                }
                if ((uint)pTrigger == 0) {
                  if (isView == 0) {
                    sqlite3OpenTable(pParse,iVar2,hasFK,pTab_00,0x28);
                  }
                  if (onError == 5) {
                    bVar1 = true;
                  }
                  else {
                    bVar1 = false;
                    for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
                      if (_iCur->onError == '\x05') {
                        bVar1 = true;
                        break;
                      }
                    }
                  }
                  local_30 = 0;
                  for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
                    if ((bVar1) || (0 < aXRef[local_30])) {
                      zP4 = sqlite3IndexKeyinfo(pParse,_iCur);
                      sqlite3VdbeAddOp4(v_00,0x28,iVar2 + local_30 + 1,_iCur->tnum,hasFK,(char *)zP4
                                        ,-0x10);
                    }
                    local_30 = local_30 + 1;
                  }
                }
                if (isView == 0) {
                  pWInfo._4_4_ = sqlite3VdbeAddOp3(v_00,0x71,iVar3,0,p3);
                }
                else {
                  iVar3 = sqlite3VdbeAddOp1(v_00,0x4a,p3);
                  pWInfo._4_4_ = sqlite3VdbeAddOp0(v_00,1);
                  sqlite3VdbeJumpHere(v_00,iVar3);
                }
                sqlite3VdbeAddOp3(v_00,0x36,iVar2,pWInfo._4_4_,p3);
                if (pRowidExpr._4_4_ != 0) {
                  sqlite3ExprCode(pParse,pEStack_90,regOld);
                  sqlite3VdbeAddOp1(v_00,0x15,regOld);
                }
                if ((pTrigger._4_4_ != 0) || (_newmask != (Trigger *)0x0)) {
                  if (pTrigger._4_4_ == 0) {
                    local_154 = 0;
                  }
                  else {
                    local_154 = sqlite3FkOldmask(pParse,pTab_00);
                  }
                  uVar5 = sqlite3TriggerColmask(pParse,_newmask,pChanges,0,3,pTab_00,onError);
                  for (local_30 = 0; local_30 < pTab_00->nCol; local_30 = local_30 + 1) {
                    if (((piStack_80[local_30] < 0) || ((uVar5 | local_154) == 0xffffffff)) ||
                       ((local_30 < 0x20 &&
                        (((uVar5 | local_154) & 1 << ((byte)local_30 & 0x1f)) != 0)))) {
                      sqlite3ExprCodeGetColumnOfTable(v_00,pTab_00,iVar2,local_30,rc + local_30);
                    }
                    else {
                      sqlite3VdbeAddOp2(v_00,10,0,rc + local_30);
                    }
                  }
                  if (pRowidExpr._4_4_ == 0) {
                    sqlite3VdbeAddOp2(v_00,0xe,p3,regOld);
                  }
                }
                uVar5 = sqlite3TriggerColmask(pParse,_newmask,pChanges,1,1,pTab_00,onError);
                sqlite3VdbeAddOp3(v_00,10,0,p2,p2 + pTab_00->nCol + -1);
                for (local_30 = 0; local_30 < pTab_00->nCol; local_30 = local_30 + 1) {
                  if (local_30 != pTab_00->iPKey) {
                    if (piStack_80[local_30] < 0) {
                      if ((((regRowCount & 1U) == 0) || (0x1f < local_30)) ||
                         ((uVar5 & 1 << ((byte)local_30 & 0x1f)) != 0)) {
                        sqlite3VdbeAddOp3(v_00,0x1d,iVar2,local_30,p2 + local_30);
                        sqlite3ColumnDefault(v_00,pTab_00,local_30,p2 + local_30);
                      }
                    }
                    else {
                      sqlite3ExprCode(pParse,pChanges->a[piStack_80[local_30]].pExpr,p2 + local_30);
                    }
                  }
                }
                if ((regRowCount & 1U) != 0) {
                  sqlite3VdbeAddOp2(v_00,0x1e,p2,(int)pTab_00->nCol);
                  sqlite3TableAffinityStr(v_00,pTab_00);
                  sqlite3CodeRowTrigger
                            (pParse,_newmask,0x6b,pChanges,1,pTab_00,p3,onError,pWInfo._4_4_);
                  sqlite3VdbeAddOp3(v_00,0x36,iVar2,pWInfo._4_4_,p3);
                  for (local_30 = 0; local_30 < pTab_00->nCol; local_30 = local_30 + 1) {
                    if ((piStack_80[local_30] < 0) && (local_30 != pTab_00->iPKey)) {
                      sqlite3VdbeAddOp3(v_00,0x1d,iVar2,local_30,p2 + local_30);
                      sqlite3ColumnDefault(v_00,pTab_00,local_30,p2 + local_30);
                    }
                  }
                }
                if ((uint)pTrigger == 0) {
                  local_17c = p3;
                  if (pRowidExpr._4_4_ == 0) {
                    local_17c = 0;
                  }
                  sqlite3GenerateConstraintChecks
                            (pParse,pTab_00,iVar2,regOld,aXRef,local_17c,1,onError,pWInfo._4_4_,
                             (int *)0x0);
                  if (pTrigger._4_4_ != 0) {
                    sqlite3FkCheck(pParse,pTab_00,p3,0);
                  }
                  iVar3 = sqlite3VdbeAddOp3(v_00,0x36,iVar2,0,p3);
                  sqlite3GenerateRowIndexDelete(pParse,pTab_00,iVar2,aXRef);
                  if ((pTrigger._4_4_ != 0) || (pRowidExpr._4_4_ != 0)) {
                    sqlite3VdbeAddOp2(v_00,0x3b,iVar2,0);
                  }
                  sqlite3VdbeJumpHere(v_00,iVar3);
                  if (pTrigger._4_4_ != 0) {
                    sqlite3FkCheck(pParse,pTab_00,0,regOld);
                  }
                  sqlite3CompleteInsertion(pParse,pTab_00,iVar2,regOld,aXRef,1,0,0);
                  if (pTrigger._4_4_ != 0) {
                    sqlite3FkActions(pParse,pTab_00,pChanges,p3);
                  }
                }
                if (((db_00->flags & 0x10U) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
                  sqlite3VdbeAddOp2(v_00,0x14,regNewRowid,1);
                }
                sqlite3CodeRowTrigger
                          (pParse,_newmask,0x6b,pChanges,2,pTab_00,p3,onError,pWInfo._4_4_);
                sqlite3VdbeAddOp2(v_00,1,0,pWInfo._4_4_);
                sqlite3VdbeJumpHere(v_00,pWInfo._4_4_);
                local_30 = 0;
                for (_iCur = pTab_00->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
                  if ((bVar1) || (0 < aXRef[local_30])) {
                    sqlite3VdbeAddOp2(v_00,0x2d,iVar2 + local_30 + 1,0);
                  }
                  local_30 = local_30 + 1;
                }
                sqlite3VdbeAddOp2(v_00,0x2d,iVar2,0);
                if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
                  sqlite3AutoincrementEnd(pParse);
                }
                if ((((db_00->flags & 0x10U) != 0) && (pParse->pTriggerTab == (Table *)0x0)) &&
                   (pParse->nested == '\0')) {
                  sqlite3VdbeAddOp2(v_00,0x10,regNewRowid,1);
                  sqlite3VdbeSetNumCols(v_00,1);
                  sqlite3VdbeSetColName(v_00,0,0,"rows updated",(_func_void_void_ptr *)0x0);
                }
              }
            }
          }
          else {
            updateVirtualTable(pParse,pTabList,pTab_00,pChanges,pEStack_90,piStack_80,pWhere,onError
                              );
            _i = (Expr *)0x0;
            pChanges_local = (ExprList *)0x0;
          }
        }
      }
    }
  }
LAB_001bbde0:
  sqlite3AuthContextPop((AuthContext *)&sNC.ncFlags);
  sqlite3DbFree(db_00,aXRef);
  sqlite3DbFree(db_00,piStack_80);
  sqlite3SrcListDelete(db_00,(SrcList *)pChanges_local);
  sqlite3ExprListDelete(db_00,pChanges);
  sqlite3ExprDelete(db_00,_i);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Update(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table in which we should change things */
  ExprList *pChanges,    /* Things to be changed */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  int onError            /* How to handle constraint errors */
){
  int i, j;              /* Loop counters */
  Table *pTab;           /* The table to be updated */
  int addr = 0;          /* VDBE instruction address of the start of the loop */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Vdbe *v;               /* The virtual database engine */
  Index *pIdx;           /* For looping over indices */
  int nIdx;              /* Number of indices that need updating */
  int iCur;              /* VDBE Cursor number of pTab */
  sqlite3 *db;           /* The database structure */
  int *aRegIdx = 0;      /* One register assigned to each index to be updated */
  int *aXRef = 0;        /* aXRef[i] is the index in pChanges->a[] of the
                         ** an expression for the i-th column of the table.
                         ** aXRef[i]==-1 if the i-th column is not changed. */
  int chngRowid;         /* True if the record number is being changed */
  Expr *pRowidExpr = 0;  /* Expression defining the new record number */
  int openAll = 0;       /* True if all indices need to be opened */
  AuthContext sContext;  /* The authorization context */
  NameContext sNC;       /* The name-context to resolve expressions in */
  int iDb;               /* Database containing the table being updated */
  int okOnePass;         /* True for one-pass algorithm without the FIFO */
  int hasFK;             /* True if foreign key processing is required */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;            /* True when updating a view (INSTEAD OF trigger) */
  Trigger *pTrigger;     /* List of triggers on pTab, if required */
  int tmask;             /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
#endif
  int newmask;           /* Mask of NEW.* columns accessed by BEFORE triggers */

  /* Register Allocations */
  int regRowCount = 0;   /* A count of rows changed */
  int regOldRowid;       /* The old rowid */
  int regNewRowid;       /* The new rowid */
  int regNew;            /* Content of the NEW.* table in triggers */
  int regOld = 0;        /* Content of OLD.* table in triggers */
  int regRowSet = 0;     /* Rowset of rows to be updated */

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto update_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to update. 
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ) goto update_cleanup;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);

  /* Figure out if we have any triggers and if the table being
  ** updated is a view.
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_UPDATE, pChanges, &tmask);
  isView = pTab->pSelect!=0;
  assert( pTrigger || tmask==0 );
#else
# define pTrigger 0
# define isView 0
# define tmask 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto update_cleanup;
  }
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto update_cleanup;
  }
  aXRef = sqlite3DbMallocRaw(db, sizeof(int) * pTab->nCol );
  if( aXRef==0 ) goto update_cleanup;
  for(i=0; i<pTab->nCol; i++) aXRef[i] = -1;

  /* Allocate a cursors for the main database table and for all indices.
  ** The index cursors might not be used, but if they are used they
  ** need to occur right after the database cursor.  So go ahead and
  ** allocate enough space, just in case.
  */
  pTabList->a[0].iCursor = iCur = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Initialize the name-context */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;

  /* Resolve the column names in all the expressions of the
  ** of the UPDATE statement.  Also find the column index
  ** for each column to be updated in the pChanges array.  For each
  ** column to be updated, make sure we have authorization to change
  ** that column.
  */
  chngRowid = 0;
  for(i=0; i<pChanges->nExpr; i++){
    if( sqlite3ResolveExprNames(&sNC, pChanges->a[i].pExpr) ){
      goto update_cleanup;
    }
    for(j=0; j<pTab->nCol; j++){
      if( sqlite3StrICmp(pTab->aCol[j].zName, pChanges->a[i].zName)==0 ){
        if( j==pTab->iPKey ){
          chngRowid = 1;
          pRowidExpr = pChanges->a[i].pExpr;
        }
        aXRef[j] = i;
        break;
      }
    }
    if( j>=pTab->nCol ){
      if( sqlite3IsRowid(pChanges->a[i].zName) ){
        j = -1;
        chngRowid = 1;
        pRowidExpr = pChanges->a[i].pExpr;
      }else{
        sqlite3ErrorMsg(pParse, "no such column: %s", pChanges->a[i].zName);
        pParse->checkSchema = 1;
        goto update_cleanup;
      }
    }
#ifndef SQLITE_OMIT_AUTHORIZATION
    {
      int rc;
      rc = sqlite3AuthCheck(pParse, SQLITE_UPDATE, pTab->zName,
                            j<0 ? "ROWID" : pTab->aCol[j].zName,
                            db->aDb[iDb].zName);
      if( rc==SQLITE_DENY ){
        goto update_cleanup;
      }else if( rc==SQLITE_IGNORE ){
        aXRef[j] = -1;
      }
    }
#endif
  }

  hasFK = sqlite3FkRequired(pParse, pTab, aXRef, chngRowid);

  /* Allocate memory for the array aRegIdx[].  There is one entry in the
  ** array for each index associated with table being updated.  Fill in
  ** the value with a register number for indices that are to be used
  ** and with zero for unused indices.
  */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  if( nIdx>0 ){
    aRegIdx = sqlite3DbMallocRaw(db, sizeof(Index*) * nIdx );
    if( aRegIdx==0 ) goto update_cleanup;
  }
  for(j=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, j++){
    int reg;
    if( hasFK || chngRowid ){
      reg = ++pParse->nMem;
    }else{
      reg = 0;
      for(i=0; i<pIdx->nColumn; i++){
        if( aXRef[pIdx->aiColumn[i]]>=0 ){
          reg = ++pParse->nMem;
          break;
        }
      }
    }
    aRegIdx[j] = reg;
  }

  /* Begin generating code. */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto update_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Virtual tables must be handled separately */
  if( IsVirtual(pTab) ){
    updateVirtualTable(pParse, pTabList, pTab, pChanges, pRowidExpr, aXRef,
                       pWhere, onError);
    pWhere = 0;
    pTabList = 0;
    goto update_cleanup;
  }
#endif

  /* Allocate required registers. */
  regRowSet = ++pParse->nMem;
  regOldRowid = regNewRowid = ++pParse->nMem;
  if( pTrigger || hasFK ){
    regOld = pParse->nMem + 1;
    pParse->nMem += pTab->nCol;
  }
  if( chngRowid || pTrigger || hasFK ){
    regNewRowid = ++pParse->nMem;
  }
  regNew = pParse->nMem + 1;
  pParse->nMem += pTab->nCol;

  /* Start the view context. */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* If we are trying to update a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in all the expressions in the
  ** WHERE clause.
  */
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto update_cleanup;
  }

  /* Begin the database scan
  */
  sqlite3VdbeAddOp3(v, OP_Null, 0, regRowSet, regOldRowid);
  pWInfo = sqlite3WhereBegin(
      pParse, pTabList, pWhere, 0, 0, WHERE_ONEPASS_DESIRED, 0
  );
  if( pWInfo==0 ) goto update_cleanup;
  okOnePass = pWInfo->okOnePass;

  /* Remember the rowid of every item to be updated.
  */
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regOldRowid);
  if( !okOnePass ){
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, regRowSet, regOldRowid);
  }

  /* End the database scan loop.
  */
  sqlite3WhereEnd(pWInfo);

  /* Initialize the count of updated rows
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  if( !isView ){
    /* 
    ** Open every index that needs updating.  Note that if any
    ** index could potentially invoke a REPLACE conflict resolution 
    ** action, then we need to open all indices because we might need
    ** to be deleting some records.
    */
    if( !okOnePass ) sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite); 
    if( onError==OE_Replace ){
      openAll = 1;
    }else{
      openAll = 0;
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Replace ){
          openAll = 1;
          break;
        }
      }
    }
    for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
      assert( aRegIdx );
      if( openAll || aRegIdx[i]>0 ){
        KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
        sqlite3VdbeAddOp4(v, OP_OpenWrite, iCur+i+1, pIdx->tnum, iDb,
                       (char*)pKey, P4_KEYINFO_HANDOFF);
        assert( pParse->nTab>iCur+i+1 );
      }
    }
  }

  /* Top of the update loop */
  if( okOnePass ){
    int a1 = sqlite3VdbeAddOp1(v, OP_NotNull, regOldRowid);
    addr = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, a1);
  }else{
    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, regRowSet, 0, regOldRowid);
  }

  /* Make cursor iCur point to the record that is being updated. If
  ** this record does not exist for some reason (deleted by a trigger,
  ** for example, then jump to the next iteration of the RowSet loop.  */
  sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

  /* If the record number will change, set register regNewRowid to
  ** contain the new value. If the record number is not being modified,
  ** then regNewRowid is the same register as regOldRowid, which is
  ** already populated.  */
  assert( chngRowid || pTrigger || hasFK || regOldRowid==regNewRowid );
  if( chngRowid ){
    sqlite3ExprCode(pParse, pRowidExpr, regNewRowid);
    sqlite3VdbeAddOp1(v, OP_MustBeInt, regNewRowid);
  }

  /* If there are triggers on this table, populate an array of registers 
  ** with the required old.* column data.  */
  if( hasFK || pTrigger ){
    u32 oldmask = (hasFK ? sqlite3FkOldmask(pParse, pTab) : 0);
    oldmask |= sqlite3TriggerColmask(pParse, 
        pTrigger, pChanges, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onError
    );
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 || oldmask==0xffffffff || (i<32 && (oldmask & (1<<i))) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOld+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, regOld+i);
      }
    }
    if( chngRowid==0 ){
      sqlite3VdbeAddOp2(v, OP_Copy, regOldRowid, regNewRowid);
    }
  }

  /* Populate the array of registers beginning at regNew with the new
  ** row data. This array is used to check constaints, create the new
  ** table and index records, and as the values for any new.* references
  ** made by triggers.
  **
  ** If there are one or more BEFORE triggers, then do not populate the
  ** registers associated with columns that are (a) not modified by
  ** this UPDATE statement and (b) not accessed by new.* references. The
  ** values for registers not modified by the UPDATE must be reloaded from 
  ** the database after the BEFORE triggers are fired anyway (as the trigger 
  ** may have modified them). So not loading those that are not going to
  ** be used eliminates some redundant opcodes.
  */
  newmask = sqlite3TriggerColmask(
      pParse, pTrigger, pChanges, 1, TRIGGER_BEFORE, pTab, onError
  );
  sqlite3VdbeAddOp3(v, OP_Null, 0, regNew, regNew+pTab->nCol-1);
  for(i=0; i<pTab->nCol; i++){
    if( i==pTab->iPKey ){
      /*sqlite3VdbeAddOp2(v, OP_Null, 0, regNew+i);*/
    }else{
      j = aXRef[i];
      if( j>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[j].pExpr, regNew+i);
      }else if( 0==(tmask&TRIGGER_BEFORE) || i>31 || (newmask&(1<<i)) ){
        /* This branch loads the value of a column that will not be changed 
        ** into a register. This is done if there are no BEFORE triggers, or
        ** if there are one or more BEFORE triggers that use this value via
        ** a new.* reference in a trigger program.
        */
        testcase( i==31 );
        testcase( i==32 );
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  /* Fire any BEFORE UPDATE triggers. This happens before constraints are
  ** verified. One could argue that this is wrong.
  */
  if( tmask&TRIGGER_BEFORE ){
    sqlite3VdbeAddOp2(v, OP_Affinity, regNew, pTab->nCol);
    sqlite3TableAffinityStr(v, pTab);
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
        TRIGGER_BEFORE, pTab, regOldRowid, onError, addr);

    /* The row-trigger may have deleted the row being updated. In this
    ** case, jump to the next row. No updates or AFTER triggers are 
    ** required. This behavior - what happens when the row being updated
    ** is deleted or renamed by a BEFORE trigger - is left undefined in the
    ** documentation.
    */
    sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

    /* If it did not delete it, the row-trigger may still have modified 
    ** some of the columns of the row being updated. Load the values for 
    ** all columns not modified by the update statement into their 
    ** registers in case this has happened.
    */
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 && i!=pTab->iPKey ){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  if( !isView ){
    int j1;                       /* Address of jump instruction */

    /* Do constraint checks. */
    sqlite3GenerateConstraintChecks(pParse, pTab, iCur, regNewRowid,
        aRegIdx, (chngRowid?regOldRowid:0), 1, onError, addr, 0);

    /* Do FK constraint checks. */
    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, regOldRowid, 0);
    }

    /* Delete the index entries associated with the current record.  */
    j1 = sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regOldRowid);
    sqlite3GenerateRowIndexDelete(pParse, pTab, iCur, aRegIdx);
  
    /* If changing the record number, delete the old record.  */
    if( hasFK || chngRowid ){
      sqlite3VdbeAddOp2(v, OP_Delete, iCur, 0);
    }
    sqlite3VdbeJumpHere(v, j1);

    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, 0, regNewRowid);
    }
  
    /* Insert the new index entries and the new record. */
    sqlite3CompleteInsertion(pParse, pTab, iCur, regNewRowid, aRegIdx, 1, 0, 0);

    /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
    ** handle rows (possibly in other tables) that refer via a foreign key
    ** to the row just updated. */ 
    if( hasFK ){
      sqlite3FkActions(pParse, pTab, pChanges, regOldRowid);
    }
  }

  /* Increment the row counter 
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
      TRIGGER_AFTER, pTab, regOldRowid, onError, addr);

  /* Repeat the above with the next record to be updated, until
  ** all record selected by the WHERE clause have been updated.
  */
  sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  sqlite3VdbeJumpHere(v, addr);

  /* Close all tables */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    assert( aRegIdx );
    if( openAll || aRegIdx[i]>0 ){
      sqlite3VdbeAddOp2(v, OP_Close, iCur+i+1, 0);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Close, iCur, 0);

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows that were changed. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->pTriggerTab && !pParse->nested ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows updated", SQLITE_STATIC);
  }

update_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3DbFree(db, aRegIdx);
  sqlite3DbFree(db, aXRef);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pChanges);
  sqlite3ExprDelete(db, pWhere);
  return;
}